

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

int __thiscall
Centaurus::CATNMachine<char>::import_literal_terminal
          (CATNMachine<char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *literal,int origin,
          int tag)

{
  bool bVar1;
  byte *pbVar2;
  CharClass<char> local_60;
  byte local_39;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char ch;
  const_iterator __end0;
  const_iterator __begin0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range2;
  int tag_local;
  int origin_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *literal_local;
  CATNMachine<char> *this_local;
  
  __end0._M_current = (char *)std::__cxx11::string::begin();
  _Stack_38._M_current = (char *)std::__cxx11::string::end();
  __range2._0_4_ = tag;
  __range2._4_4_ = origin;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end0);
    local_39 = *pbVar2;
    CharClass<char>::CharClass(&local_60,(uint)local_39,(uint)local_39 + L'\x01');
    __range2._4_4_ = add_node(this,&local_60,__range2._4_4_,(int)__range2);
    CharClass<char>::~CharClass(&local_60);
    __range2._0_4_ = 0;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end0);
  }
  return __range2._4_4_;
}

Assistant:

int import_literal_terminal(const std::basic_string<TCHAR>& literal, int origin, int tag)
    {
        for (TCHAR ch : literal)
        {
            origin = add_node(CharClass<TCHAR>(ch, ch + 1), origin, tag);
            tag = 0;
        }
        return origin;
    }